

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O3

void Diligent::CopyPipelineResourceSignatureDesc
               (FixedLinearAllocator *Allocator,PipelineResourceSignatureDesc *SrcDesc,
               PipelineResourceSignatureDesc *DstDesc,array<unsigned_short,_4UL> *ResourceOffsets)

{
  PipelineResourceDesc *pPVar1;
  ImmutableSamplerDesc *pIVar2;
  undefined8 uVar3;
  FixedLinearAllocator *this;
  PipelineResourceSignatureDesc *pPVar4;
  unsigned_short uVar5;
  PipelineResourceDesc *__seed;
  ImmutableSamplerDesc *pIVar6;
  Char *pCVar7;
  char *pcVar8;
  array<unsigned_short,_4UL> *Args_1;
  long lVar9;
  ulong uVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  ulong uVar14;
  byte bVar15;
  string msg;
  string local_70;
  ImmutableSamplerDesc *local_50;
  FixedLinearAllocator *local_48;
  PipelineResourceDesc *local_40;
  PipelineResourceSignatureDesc *local_38;
  
  bVar15 = 0;
  Args_1 = ResourceOffsets;
  __seed = FixedLinearAllocator::ConstructArray<Diligent::PipelineResourceDesc>
                     (Allocator,(ulong)SrcDesc->NumResources);
  local_48 = Allocator;
  pIVar6 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                     (Allocator,(ulong)SrcDesc->NumImmutableSamplers);
  local_38 = DstDesc;
  if (SrcDesc->NumResources != 0) {
    lVar11 = 0;
    uVar14 = 0;
    local_50 = pIVar6;
    do {
      pPVar1 = SrcDesc->Resources;
      *(undefined8 *)(&__seed->ResourceType + lVar11) =
           *(undefined8 *)(&pPVar1->ResourceType + lVar11);
      puVar13 = (undefined8 *)((long)&pPVar1->Name + lVar11);
      uVar3 = puVar13[1];
      puVar12 = (undefined8 *)((long)&__seed->Name + lVar11);
      *puVar12 = *puVar13;
      puVar12[1] = uVar3;
      pcVar8 = *(char **)((long)&pPVar1->Name + lVar11);
      if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
        FormatString<char[26],char[49]>
                  (&local_70,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SrcRes.Name != nullptr && SrcRes.Name[0] != \'\\0\'",
                   (char (*) [49])Args_1);
        Args_1 = (array<unsigned_short,_4UL> *)0x1db;
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"CopyPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1db);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pcVar8 = *(char **)((long)&pPVar1->Name + lVar11);
      }
      pCVar7 = FixedLinearAllocator::CopyString(local_48,pcVar8,0);
      pIVar6 = local_50;
      *(Char **)((long)&__seed->Name + lVar11) = pCVar7;
      ResourceOffsets->_M_elems[(ulong)(&__seed->VarType)[lVar11] + 1] =
           ResourceOffsets->_M_elems[(ulong)(&__seed->VarType)[lVar11] + 1] + 1;
      uVar14 = uVar14 + 1;
      uVar10 = (ulong)SrcDesc->NumResources;
      lVar11 = lVar11 + 0x18;
    } while (uVar14 < uVar10);
    if (uVar10 != 0) {
      local_40 = __seed + uVar10;
      std::_Temporary_buffer<Diligent::PipelineResourceDesc_*,_Diligent::PipelineResourceDesc>::
      _Temporary_buffer((_Temporary_buffer<Diligent::PipelineResourceDesc_*,_Diligent::PipelineResourceDesc>
                         *)&local_70,__seed,uVar10 + 1 >> 1);
      if ((void *)local_70.field_2._M_allocated_capacity == (void *)0x0) {
        std::
        __inplace_stable_sort<Diligent::PipelineResourceDesc*,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::CopyPipelineResourceSignatureDesc(Diligent::FixedLinearAllocator&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureDesc&,std::array<unsigned_short,4ul>&)::__0>>
                  (__seed,local_40);
      }
      else {
        std::
        __stable_sort_adaptive<Diligent::PipelineResourceDesc*,Diligent::PipelineResourceDesc*,long,__gnu_cxx::__ops::_Iter_comp_iter<Diligent::CopyPipelineResourceSignatureDesc(Diligent::FixedLinearAllocator&,Diligent::PipelineResourceSignatureDesc_const&,Diligent::PipelineResourceSignatureDesc&,std::array<unsigned_short,4ul>&)::__0>>
                  (__seed,local_40,local_70.field_2._M_allocated_capacity,local_70._M_string_length)
        ;
      }
      operator_delete((void *)local_70.field_2._M_allocated_capacity,
                      local_70._M_string_length * 0x18);
    }
  }
  uVar5 = ResourceOffsets->_M_elems[0];
  lVar11 = 1;
  do {
    uVar5 = uVar5 + ResourceOffsets->_M_elems[lVar11];
    ResourceOffsets->_M_elems[lVar11] = uVar5;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  local_50 = (ImmutableSamplerDesc *)__seed;
  if (SrcDesc->NumImmutableSamplers != 0) {
    lVar11 = 0x10;
    uVar14 = 0;
    do {
      pIVar2 = SrcDesc->ImmutableSamplers;
      puVar12 = (undefined8 *)((long)(pIVar2->Desc).BorderColor + lVar11 + -0x3c);
      puVar13 = (undefined8 *)((long)(pIVar6->Desc).BorderColor + lVar11 + -0x3c);
      for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar13 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
      }
      pcVar8 = *(char **)((long)(pIVar2->Desc).BorderColor + lVar11 + -0x34);
      if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
        FormatString<char[26],char[81]>
                  (&local_70,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "SrcSam.SamplerOrTextureName != nullptr && SrcSam.SamplerOrTextureName[0] != \'\\0\'"
                   ,(char (*) [81])0x0);
        DebugAssertionFailed
                  (local_70._M_dataplus._M_p,"CopyPipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x1f6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        pcVar8 = *(char **)((long)(pIVar2->Desc).BorderColor + lVar11 + -0x34);
      }
      this = local_48;
      pCVar7 = FixedLinearAllocator::CopyString(local_48,pcVar8,0);
      *(Char **)((long)(pIVar6->Desc).BorderColor + lVar11 + -0x34) = pCVar7;
      pcVar8 = FixedLinearAllocator::CopyString
                         (this,*(char **)((long)(pIVar2->Desc).BorderColor + lVar11 + -0x2c),0);
      if (pcVar8 == (Char *)0x0) {
        pcVar8 = "";
      }
      *(char **)((long)(pIVar6->Desc).BorderColor + lVar11 + -0x2c) = pcVar8;
      uVar14 = uVar14 + 1;
      lVar11 = lVar11 + 0x48;
    } while (uVar14 < SrcDesc->NumImmutableSamplers);
  }
  pPVar4 = local_38;
  local_38->Resources = (PipelineResourceDesc *)local_50;
  local_38->ImmutableSamplers = pIVar6;
  if (SrcDesc->UseCombinedTextureSamplers != false) {
    pCVar7 = FixedLinearAllocator::CopyString(local_48,SrcDesc->CombinedSamplerSuffix,0);
    pPVar4->CombinedSamplerSuffix = pCVar7;
  }
  return;
}

Assistant:

void CopyPipelineResourceSignatureDesc(FixedLinearAllocator&                                            Allocator,
                                       const PipelineResourceSignatureDesc&                             SrcDesc,
                                       PipelineResourceSignatureDesc&                                   DstDesc,
                                       std::array<Uint16, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES + 1>& ResourceOffsets)
{
    PipelineResourceDesc* pResources = Allocator.ConstructArray<PipelineResourceDesc>(SrcDesc.NumResources);
    ImmutableSamplerDesc* pSamplers  = Allocator.ConstructArray<ImmutableSamplerDesc>(SrcDesc.NumImmutableSamplers);

    for (Uint32 i = 0; i < SrcDesc.NumResources; ++i)
    {
        const PipelineResourceDesc& SrcRes = SrcDesc.Resources[i];
        PipelineResourceDesc&       DstRes = pResources[i];

        DstRes = SrcRes;
        VERIFY_EXPR(SrcRes.Name != nullptr && SrcRes.Name[0] != '\0');
        DstRes.Name = Allocator.CopyString(SrcRes.Name);

        ++ResourceOffsets[size_t{DstRes.VarType} + 1];
    }

    // Sort resources by variable type (all static -> all mutable -> all dynamic).
    // NB: It is crucial to use stable sort to make sure that relative
    //     positions of resources are preserved.
    //     std::sort may reposition equal elements differently depending on
    //     the original arrangement, e.g.:
    //          B1 B2 A1 A2 -> A1 A2 B1 B2
    //          A1 B1 A2 B2 -> A2 A1 B2 B1
    std::stable_sort(pResources, pResources + SrcDesc.NumResources,
                     [](const PipelineResourceDesc& lhs, const PipelineResourceDesc& rhs) {
                         return lhs.VarType < rhs.VarType;
                     });

    for (size_t i = 1; i < ResourceOffsets.size(); ++i)
        ResourceOffsets[i] += ResourceOffsets[i - 1];

    for (Uint32 i = 0; i < SrcDesc.NumImmutableSamplers; ++i)
    {
        const ImmutableSamplerDesc& SrcSam = SrcDesc.ImmutableSamplers[i];
        ImmutableSamplerDesc&       DstSam = pSamplers[i];

        DstSam = SrcSam;
        VERIFY_EXPR(SrcSam.SamplerOrTextureName != nullptr && SrcSam.SamplerOrTextureName[0] != '\0');
        DstSam.SamplerOrTextureName = Allocator.CopyString(SrcSam.SamplerOrTextureName);
        DstSam.Desc.Name            = Allocator.CopyString(SrcSam.Desc.Name);
        if (!DstSam.Desc.Name)
            DstSam.Desc.Name = "";
    }

    DstDesc.Resources         = pResources;
    DstDesc.ImmutableSamplers = pSamplers;

    if (SrcDesc.UseCombinedTextureSamplers)
        DstDesc.CombinedSamplerSuffix = Allocator.CopyString(SrcDesc.CombinedSamplerSuffix);
}